

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)

{
  int iVar1;
  bool bVar2;
  STRING_HANDLE pSVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  int iVar6;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar6 = 0xd08;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin",0xd07,1,
                "Invalid handle parameter. NULL.");
    }
  }
  else {
    bVar2 = true;
    iVar6 = 0;
    if (*(long *)((long)handle + 0x10) == 0) {
      pSVar3 = STRING_construct("$iothub/twin/res/#");
      *(STRING_HANDLE *)((long)handle + 0x10) = pSVar3;
      if (pSVar3 == (STRING_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        iVar6 = 0xd12;
        if (p_Var4 == (LOGGER_LOG)0x0) {
          bVar2 = false;
        }
        else {
          bVar2 = false;
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin",0xd11,1,
                    "Failure: unable constructing reported state topic");
        }
      }
      else {
        *(byte *)((long)handle + 0x30) = *(byte *)((long)handle + 0x30) | 1;
        iVar6 = 0;
      }
    }
    if (bVar2) {
      iVar1 = *(int *)((long)handle + 0xf0);
      iVar5 = 0;
      iVar6 = 0;
      if (((1 < iVar1 - 0xe0U) && (iVar6 = iVar5, iVar1 != 0x10)) && (iVar1 != 0x20)) {
        *(undefined4 *)((long)handle + 0xf0) = 0x80;
      }
    }
  }
  return iVar6;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe_DeviceTwin(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else
    {
        if (transport_data->topic_GetState == NULL)
        {
            transport_data->topic_GetState = STRING_construct(TOPIC_GET_DESIRED_STATE);
            if (transport_data->topic_GetState == NULL)
            {
                LogError("Failure: unable constructing reported state topic");
                result = MU_FAILURE;
            }
            else
            {
                transport_data->topics_ToSubscribe |= SUBSCRIBE_GET_REPORTED_STATE_TOPIC;
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
        if (result == 0)
        {
            changeStateToSubscribeIfAllowed(transport_data);
        }
    }
    return result;
}